

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderNamespaceUri(xmlTextReaderPtr reader)

{
  xmlNodePtr local_20;
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    if (reader->curnode == (xmlNodePtr)0x0) {
      local_20 = reader->node;
    }
    else {
      local_20 = reader->curnode;
    }
    if (local_20->type == XML_NAMESPACE_DECL) {
      reader_local = (xmlTextReaderPtr)xmlStrdup((xmlChar *)"http://www.w3.org/2000/xmlns/");
    }
    else if ((local_20->type == XML_ELEMENT_NODE) || (local_20->type == XML_ATTRIBUTE_NODE)) {
      if (local_20->ns == (xmlNs *)0x0) {
        reader_local = (xmlTextReaderPtr)0x0;
      }
      else {
        reader_local = (xmlTextReaderPtr)xmlStrdup(local_20->ns->href);
      }
    }
    else {
      reader_local = (xmlTextReaderPtr)0x0;
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderNamespaceUri(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    if (node->type == XML_NAMESPACE_DECL)
	return(xmlStrdup(BAD_CAST "http://www.w3.org/2000/xmlns/"));
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->type != XML_ATTRIBUTE_NODE))
	return(NULL);
    if (node->ns != NULL)
	return(xmlStrdup(node->ns->href));
    return(NULL);
}